

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ansv.cpp
# Opt level: O0

void check_ansv<unsigned_long,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *nsv,bool left,size_t nonsv)

{
  unsigned_long uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference puVar5;
  Message *pMVar6;
  char *pcVar7;
  ulong uVar8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var9;
  const_reference pvVar10;
  char *in_R9;
  bool local_399;
  bool local_371;
  bool local_329;
  AssertHelper local_318;
  Message local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_2d8;
  undefined1 *local_2d0;
  Message local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__3;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2a0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_298;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_290;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_288;
  ulong local_280;
  unsigned_long m_3;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_2;
  Message local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_218;
  Message local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1d8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1d0;
  ulong local_1c8;
  unsigned_long m_2;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  size_t s;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_150;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_148;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_140;
  unsigned_long local_138;
  unsigned_long m_1;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_e0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d8;
  unsigned_long *local_d0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c0;
  unsigned_long local_b8;
  unsigned_long m;
  size_t i;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a0;
  undefined1 local_98 [8];
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  minquery;
  size_t nonsv_local;
  bool left_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nsv_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_local;
  
  minquery.block_mins.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)nonsv;
  local_a0._M_current =
       (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
  i = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend(in);
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  ::rmq((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
         *)local_98,local_a0,
        (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         )i,0x100,8);
  for (m = 0; uVar1 = m,
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in), uVar1 < sVar3;
      m = m + 1) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](nsv,m);
    if ((pointer)*pvVar4 ==
        minquery.block_mins.
        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((left) && (m != 0)) {
        local_c8._M_current =
             (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in)
        ;
        local_e0._M_current =
             (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in)
        ;
        local_d8 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator+(&local_e0,m);
        local_d0 = (unsigned_long *)
                   __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator+(&local_d8,1);
        local_c0 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                   ::query((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                            *)local_98,local_c8,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_d0);
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_c0);
        local_b8 = *puVar5;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
        local_329 = true;
        if (*pvVar4 != local_b8) {
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,0);
          local_329 = *pvVar4 == local_b8;
        }
        testing::AssertionResult::AssertionResult((AssertionResult *)local_100,local_329);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
        if (!bVar2) {
          testing::Message::Message(&local_108);
          pMVar6 = testing::Message::operator<<(&local_108,(char (*) [7])" at i=");
          pMVar6 = testing::Message::operator<<(pMVar6,&m);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&m_1,(internal *)local_100,
                     (AssertionResult *)"in[i] == m || in[0] == m","false","true",in_R9);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x29,pcVar7);
          testing::internal::AssertHelper::operator=(&local_110,pMVar6);
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          std::__cxx11::string::~string((string *)&m_1);
          testing::Message::~Message(&local_108);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      }
      else if ((!left) &&
              (uVar8 = m + 1,
              sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in),
              uVar8 < sVar3)) {
        local_150._M_current =
             (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in)
        ;
        local_148 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator+(&local_150,m);
        gtest_ar__1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend(in);
        local_140 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                    ::query((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                             *)local_98,local_148,
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )gtest_ar__1.message_.ptr_);
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_140);
        local_138 = *puVar5;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
        testing::AssertionResult::AssertionResult((AssertionResult *)local_168,*pvVar4 == local_138)
        ;
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
        if (!bVar2) {
          testing::Message::Message(&local_170);
          pMVar6 = testing::Message::operator<<(&local_170,(char (*) [7])" at i=");
          pMVar6 = testing::Message::operator<<(pMVar6,&m);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&s,(internal *)local_168,(AssertionResult *)"in[i] == m","false",
                     "true",in_R9);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x2c,pcVar7);
          testing::internal::AssertHelper::operator=(&local_178,pMVar6);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          std::__cxx11::string::~string((string *)&s);
          testing::Message::~Message(&local_170);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
      }
    }
    else {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](nsv,m);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pvVar4;
      if (left) {
        testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                  ((internal *)local_1b0,"s","i",(unsigned_long *)&gtest_ar.message_,&m);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
        if (!bVar2) {
          testing::Message::Message(&local_1b8);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&m_2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x31,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&m_2,&local_1b8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m_2);
          testing::Message::~Message(&local_1b8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
        if (&(gtest_ar.message_.ptr_)->field_0x1 < m) {
          local_1e8._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
          local_1e0 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(&local_1e8,(difference_type)gtest_ar.message_.ptr_);
          local_1d8 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(&local_1e0,1);
          gtest_ar__2.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
          _Var9 = __gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&gtest_ar__2.message_,m);
          local_1d0 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                      ::query((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                               *)local_98,local_1d8,_Var9);
          puVar5 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_1d0);
          local_1c8 = *puVar5;
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
          local_371 = false;
          if (*pvVar4 < local_1c8) {
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (in,(size_type)gtest_ar.message_.ptr_);
            local_371 = *pvVar4 < local_1c8;
          }
          testing::AssertionResult::AssertionResult((AssertionResult *)local_208,local_371);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
          if (!bVar2) {
            testing::Message::Message(&local_210);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1.message_,(internal *)local_208,
                       (AssertionResult *)"in[i] < m && in[s] < m","false","true",in_R9);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_218,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x4c,pcVar7);
            testing::internal::AssertHelper::operator=(&local_218,&local_210);
            testing::internal::AssertHelper::~AssertHelper(&local_218);
            std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_210);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
        }
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in,(size_type)gtest_ar.message_.ptr_);
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                  ((internal *)local_248,"in[s]","in[i]",pvVar4,pvVar10);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
        if (!bVar2) {
          testing::Message::Message(&local_250);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x53,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_2.message_,&local_250);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_250);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      }
      else {
        testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                  ((internal *)local_268,"s","i",(unsigned_long *)&gtest_ar.message_,&m);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
        if (!bVar2) {
          testing::Message::Message(&local_270);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&m_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x57,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&m_3,&local_270);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m_3);
          testing::Message::~Message(&local_270);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
        if (m < (undefined1 *)((long)&gtest_ar.message_.ptr_[-1].field_2 + 0xfU)) {
          local_2a0._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
          local_298 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(&local_2a0,m);
          local_290 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(&local_298,1);
          gtest_ar__3.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
          _Var9 = __gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&gtest_ar__3.message_,(difference_type)gtest_ar.message_.ptr_);
          local_288 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                      ::query((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                               *)local_98,local_290,_Var9);
          puVar5 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_288);
          local_280 = *puVar5;
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
          local_399 = false;
          if (*pvVar4 < local_280) {
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (in,(size_type)gtest_ar.message_.ptr_);
            local_399 = *pvVar4 < local_280;
          }
          testing::AssertionResult::AssertionResult((AssertionResult *)local_2c0,local_399);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
          if (!bVar2) {
            testing::Message::Message(&local_2c8);
            pMVar6 = testing::Message::operator<<(&local_2c8,(char (*) [13])" for range [");
            pMVar6 = testing::Message::operator<<(pMVar6,&m);
            pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [2])",");
            local_2d0 = (undefined1 *)((long)&gtest_ar.message_.ptr_[-1].field_2 + 0xf);
            pMVar6 = testing::Message::operator<<(pMVar6,(unsigned_long *)&local_2d0);
            pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [2])0x1d57b8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_3.message_,(internal *)local_2c0,
                       (AssertionResult *)"in[i] < m && in[s] < m","false","true",in_R9);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2d8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x70,pcVar7);
            testing::internal::AssertHelper::operator=(&local_2d8,pMVar6);
            testing::internal::AssertHelper::~AssertHelper(&local_2d8);
            std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_2c8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
        }
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in,(size_type)gtest_ar.message_.ptr_);
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                  ((internal *)local_308,"in[s]","in[i]",pvVar4,pvVar10);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
        if (!bVar2) {
          testing::Message::Message(&local_310);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
          testing::internal::AssertHelper::AssertHelper
                    (&local_318,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x77,pcVar7);
          testing::internal::AssertHelper::operator=(&local_318,&local_310);
          testing::internal::AssertHelper::~AssertHelper(&local_318);
          testing::Message::~Message(&local_310);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
      }
    }
  }
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  ::~rmq((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
          *)local_98);
  return;
}

Assistant:

void check_ansv(const std::vector<T>& in, const std::vector<size_t>& nsv, bool left, size_t nonsv) {
    // construct RMQ
    rmq<typename std::vector<T>::const_iterator> minquery(in.cbegin(), in.cend());

    // for each position check the nsv and direction
    for (size_t i = 0; i < in.size(); ++i) {
        if (nsv[i] == nonsv) {
            if (left && i > 0) {
                // expect this is an overall minimum of the range [0, i]
                T m = *minquery.query(in.cbegin(), in.cbegin()+i+1);
                EXPECT_TRUE(in[i] == m || in[0] == m) << " at i=" << i;
            } else if (!left && i+1 < in.size()) {
                T m = *minquery.query(in.cbegin()+i, in.cend());
                EXPECT_TRUE(in[i] == m) << " at i=" << i;
            }
        } else {
            size_t s = nsv[i];
            if (left) {
                EXPECT_LT(s, i);
                // no other element can be smaller than `in[i]` after `in[s]`
                if (s+1 < i) {
                    T m = *minquery.query(in.cbegin()+s+1, in.cbegin()+i);
                    if (type == nearest_sm) {
                        // check that there is nothing smaller than in[i] in the range
                        EXPECT_TRUE(in[i] <= m && in[s] < m) << " for range [" << s+1 << "," << i << "]";
                    } else if (type == furthest_eq) {
                        // test that no smaller values lay in between
                        EXPECT_TRUE(in[i] <= m && in[s] <= m);

                        // test if the nsv is actually the furthest
                        if (in[i] == in[s]) {
                            // if equal, then s has to be the furthest
                            // we check that the nsv for s is smaller, not equal
                            if (nsv[s] != nonsv) {
                                EXPECT_LT(in[nsv[s]], in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                                if (nsv[s]+1 < s) {
                                    T m2 = *minquery.query(in.cbegin()+nsv[s]+1, in.cbegin()+s);
                                    EXPECT_GT(m2, in[i]);
                                }
                            }
                        } else {
                            // if not equal, there can't be any equal ones in between
                            EXPECT_LT(in[i], m) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s;
                        }
                    } else { // type == nearest_eq
                        EXPECT_TRUE(in[i] < m && in[s] < m);
                    }
                }
                // element at `s` is smaller than `in[i]`
                if (type == nearest_sm) {
                    EXPECT_LT(in[s], in[i]);
                } else {
                    EXPECT_LE(in[s], in[i]);
                }

            } else {
                EXPECT_GT(s, i);
                // no other element can be smaller than `in[i]` before `in[s]`
                if (i < s-1) {
                    T m = *minquery.query(in.cbegin()+i+1, in.cbegin()+s);
                    if (type == nearest_sm) {
                        EXPECT_TRUE(in[i] <= m && in[s] < m) << " for range [" << i << "," << s-1 << "]";
                    } else if (type == furthest_eq) {
                        EXPECT_TRUE(in[i] <= m && in[s] <= m) << " for range [" << i << "," << s-1 << "]";
                        // test if the nsv is actually the furthest
                        if (in[i] == in[s]) {
                            // if equal, then s has to be the furthest
                            // we check that the nsv for s is smaller, not equal
                            if (nsv[s] != nonsv) {
                                EXPECT_LT(in[nsv[s]], in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                                if (s+1 < nsv[s]) {
                                    T m2 = *minquery.query(in.cbegin()+s+1, in.cbegin()+nsv[s]);
                                    EXPECT_GT(m2, in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();

                                }
                            }
                        } else {
                            // if not equal, there can't be any equal ones in between
                            EXPECT_LT(in[i], m) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                        }
                    } else { // type == nearest_eq
                        EXPECT_TRUE(in[i] < m && in[s] < m) << " for range [" << i << "," << s-1 << "]";
                    }
                }
                // element at `s` is smaller than in[i]
                if (type == nearest_sm) {
                    EXPECT_LT(in[s], in[i]);
                } else {
                    EXPECT_LE(in[s], in[i]);
                }
            }

        }
    }
}